

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bs.cc
# Opt level: O0

void output_example(vw *all,bs *d,example *ec)

{
  double dVar1;
  int *piVar2;
  bool bVar3;
  size_t sVar4;
  reference pdVar5;
  int **ppiVar6;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  int sink;
  int *__end1;
  int *__begin1;
  v_array<int> *__range1;
  double v;
  iterator __end2;
  iterator __begin2;
  vector<double,_std::allocator<double>_> *__range2;
  label_data *ld;
  float in_stack_000001f8;
  float in_stack_000001fc;
  float in_stack_00000200;
  int in_stack_00000204;
  v_array<char> in_stack_00000210;
  example *in_stack_ffffffffffffff58;
  vw *in_stack_ffffffffffffff60;
  int *local_50;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_30;
  undefined8 local_28;
  float *local_20;
  long local_18;
  long local_10;
  long *local_8;
  
  local_20 = (float *)(in_RDX + 0x6828);
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  shared_data::update((shared_data *)*in_RDI,(bool)(*(byte *)(in_RDX + 0x68c8) & 1),
                      *local_20 != 3.4028235e+38,*(float *)(in_RDX + 0x68b0),
                      *(float *)(in_RDX + 0x6870),*(size_t *)(in_RDX + 0x68a0));
  if (((*local_20 != 3.4028235e+38) || (NAN(*local_20))) &&
     ((*(byte *)(local_18 + 0x68c8) & 1) == 0)) {
    *(double *)(*local_8 + 0x38) =
         (double)*local_20 * (double)*(float *)(local_18 + 0x6870) + *(double *)(*local_8 + 0x38);
  }
  sVar4 = v_array<int>::size((v_array<int> *)(local_8 + 0x6a2));
  if (sVar4 != 0) {
    *(undefined4 *)(local_10 + 0x10) = 0x7f7fffff;
    *(undefined4 *)(local_10 + 0x14) = 0xff7fffff;
    local_28 = *(undefined8 *)(local_10 + 0x18);
    local_30._M_current =
         (double *)
         std::vector<double,_std::allocator<double>_>::begin
                   ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff58);
    std::vector<double,_std::allocator<double>_>::end
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff58);
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                               *)in_stack_ffffffffffffff60,
                              (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                               *)in_stack_ffffffffffffff58), bVar3) {
      pdVar5 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_30);
      dVar1 = *pdVar5;
      if ((double)*(float *)(local_10 + 0x14) < dVar1) {
        *(float *)(local_10 + 0x14) = (float)dVar1;
      }
      if (dVar1 < (double)*(float *)(local_10 + 0x10)) {
        *(float *)(local_10 + 0x10) = (float)dVar1;
      }
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&local_30);
    }
  }
  ppiVar6 = v_array<int>::begin((v_array<int> *)(local_8 + 0x6a2));
  local_50 = *ppiVar6;
  ppiVar6 = v_array<int>::end((v_array<int> *)(local_8 + 0x6a2));
  piVar2 = *ppiVar6;
  for (; local_50 != piVar2; local_50 = local_50 + 1) {
    in_stack_ffffffffffffff58 = *(example **)(local_18 + 0x6878);
    in_stack_ffffffffffffff60 = *(vw **)(local_18 + 0x6880);
    print_result(in_stack_00000204,in_stack_00000200,in_stack_00000210,in_stack_000001fc,
                 in_stack_000001f8);
  }
  print_update(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  return;
}

Assistant:

void output_example(vw& all, bs& d, example& ec)
{
  label_data& ld = ec.l.simple;

  all.sd->update(ec.test_only, ld.label != FLT_MAX, ec.loss, ec.weight, ec.num_features);
  if (ld.label != FLT_MAX && !ec.test_only)
    all.sd->weighted_labels += ((double)ld.label) * ec.weight;

  if (all.final_prediction_sink.size() != 0)  // get confidence interval only when printing out predictions
  {
    d.lb = FLT_MAX;
    d.ub = -FLT_MAX;
    for (double v : *d.pred_vec)
    {
      if (v > d.ub)
        d.ub = (float)v;
      if (v < d.lb)
        d.lb = (float)v;
    }
  }

  for (int sink : all.final_prediction_sink) print_result(sink, ec.pred.scalar, ec.tag, d.lb, d.ub);

  print_update(all, ec);
}